

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs,RK_S32 idc)

{
  uint uVar1;
  uint uVar2;
  MppBuffer buffer;
  byte bVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  RK_S32 (*paRVar7) [2];
  long lVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  uint *__s;
  uint local_bcb8 [12066];
  
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_set_cabac_idc");
  }
  if ((-1 < idc) && (bufs->cabac_table == (MppBuffer)0x0)) {
    mpp_buffer_get_with_tag
              (bufs->group,&bufs->cabac_table,0xbc80,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_set_cabac_idc");
  }
  buffer = bufs->cabac_table;
  if (((buffer != (MppBuffer)0x0) && (-1 < idc)) && (bufs->cabac_init_idc != idc)) {
    __s = local_bcb8;
    memset(__s,0,0xbc80);
    for (lVar10 = 0; lVar10 != 0x34; lVar10 = lVar10 + 1) {
      puVar5 = __s;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        paRVar7 = h264_context_init[(uint)idc];
        if (lVar6 == 0) {
          paRVar7 = h264_context_init_intra;
        }
        for (lVar8 = 0; lVar8 != 0x1cc; lVar8 = lVar8 + 1) {
          iVar9 = ((*(RK_S32 (*) [460] [2])paRVar7)[lVar8][0] * (int)lVar10 >> 4) +
                  (*(RK_S32 (*) [460] [2])paRVar7)[lVar8][1];
          iVar4 = iVar9;
          if (0x7d < iVar9) {
            iVar4 = 0x7e;
          }
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          bVar3 = (char)iVar4 * '\x02';
          bVar11 = bVar3 + 0x81;
          if (iVar9 < 0x40) {
            bVar11 = bVar3 ^ 0x7e;
          }
          *(byte *)((long)puVar5 + lVar8) = bVar11;
        }
        puVar5 = puVar5 + 0x74;
      }
      __s = __s + 0xe8;
    }
    for (lVar10 = 1; (int)lVar10 != 0x2f21; lVar10 = lVar10 + 2) {
      uVar1 = local_bcb8[lVar10 + -1];
      uVar2 = local_bcb8[lVar10];
      local_bcb8[lVar10 + -1] =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_bcb8[lVar10] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    mpp_buffer_write_with_caller(buffer,0,local_bcb8,0xbc80,"vepu_write_cabac_table");
  }
  bufs->cabac_init_idc = idc;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_set_cabac_idc",bufs);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs, RK_S32 idc)
{
    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (idc >= 0 && !bufs->cabac_table)
        mpp_buffer_get(bufs->group, &bufs->cabac_table, H264E_CABAC_TABLE_BUF_SIZE);

    if (bufs->cabac_table && idc != bufs->cabac_init_idc && idc >= 0)
        vepu_write_cabac_table(bufs->cabac_table, idc);

    bufs->cabac_init_idc = idc;

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return MPP_OK;
}